

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMParentNode::appendChildFast(DOMParentNode *this,DOMNode *newChild)

{
  DOMNode *pDVar1;
  DOMNodeImpl *pDVar2;
  DOMChildNode *pDVar3;
  DOMChildNode *newChild_ci;
  DOMNode *lastChild;
  DOMNode *newChild_local;
  DOMParentNode *this_local;
  
  pDVar1 = getContainingNode(this);
  pDVar2 = xercesc_4_0::castToNodeImpl(newChild);
  pDVar2->fOwnerNode = pDVar1;
  pDVar2 = xercesc_4_0::castToNodeImpl(newChild);
  DOMNodeImpl::isOwned(pDVar2,true);
  if (this->fFirstChild == (DOMNode *)0x0) {
    this->fFirstChild = newChild;
    pDVar2 = xercesc_4_0::castToNodeImpl(newChild);
    DOMNodeImpl::isFirstChild(pDVar2,true);
    pDVar3 = castToChildImpl(newChild);
    pDVar3->previousSibling = newChild;
  }
  else {
    pDVar3 = castToChildImpl(this->fFirstChild);
    pDVar1 = pDVar3->previousSibling;
    pDVar3 = castToChildImpl(pDVar1);
    pDVar3->nextSibling = newChild;
    pDVar3 = castToChildImpl(newChild);
    pDVar3->previousSibling = pDVar1;
    pDVar3 = castToChildImpl(this->fFirstChild);
    pDVar3->previousSibling = newChild;
  }
  return newChild;
}

Assistant:

DOMNode * DOMParentNode::appendChildFast(DOMNode *newChild)
{
    // This function makes the following assumptions:
    //
    // - newChild != 0
    // - newChild is not read-only
    // - newChild is not a document fragment
    // - owner documents of this node and newChild are the same
    // - appending newChild to this node cannot result in a cycle
    // - DOMDocumentImpl::isKidOK (this, newChild) return true (that is,
    //   appending newChild to this node results in a valid structure)
    // - newChild->getParentNode() is 0
    // - there are no ranges set for this document
    //

    // Attach up
    castToNodeImpl(newChild)->fOwnerNode = getContainingNode();
    castToNodeImpl(newChild)->isOwned(true);

    // Attach before and after
    // Note: fFirstChild.previousSibling == lastChild!!
    if (fFirstChild != 0)
    {
        DOMNode *lastChild = castToChildImpl(fFirstChild)->previousSibling;
        castToChildImpl(lastChild)->nextSibling = newChild;
        castToChildImpl(newChild)->previousSibling = lastChild;
        castToChildImpl(fFirstChild)->previousSibling = newChild;
    }
    else
    {
        // this our first and only child
        fFirstChild = newChild;
        castToNodeImpl(newChild)->isFirstChild(true);
        // castToChildImpl(newChild)->previousSibling = newChild;
        DOMChildNode *newChild_ci = castToChildImpl(newChild);
        newChild_ci->previousSibling = newChild;
    }

    return newChild;
}